

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

void __thiscall cs_impl::runtime_cs_ext::fiber_callable::operator()(fiber_callable *this)

{
  pointer paVar1;
  pointer paVar2;
  pointer this_00;
  
  (*this->func->call_ptr)((function *)&stack0xffffffffffffffd8,(vector *)this->func);
  any::recycle((any *)&stack0xffffffffffffffd8);
  paVar1 = (this->args).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar2 = (this->args).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = paVar1;
  if (paVar2 != paVar1) {
    do {
      any::recycle(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != paVar2);
    (this->args).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Vector_impl_data._M_finish = paVar1;
  }
  cs::instance_type::clear_context
            ((((this->context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  return;
}

Assistant:

void operator()() const noexcept
			{
				try {
					func->call(args);
					args.clear();
					context->instance->clear_context();
				}
				catch (const lang_error &le) {
					std::cerr << "coroutine terminated after throwing an instance of runtime exception" << std::endl;
					std::cerr << "what(): " << le.what() << std::endl;
				}
				catch (const std::exception &e) {
					std::cerr << "coroutine terminated after throwing an instance of exception" << std::endl;
					std::cerr << "what(): " << e.what() << std::endl;
				}
				catch (...) {
					std::cerr << "coroutine terminated after throwing an instance of unknown exception" << std::endl;
				}
			}